

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<AssignStatementAstNode>_> * __thiscall
Parser::parseAssignStatement
          (optional<std::shared_ptr<AssignStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  TokenType type;
  byte local_139;
  shared_ptr<AssignStatementAstNode> local_f0;
  undefined4 local_e0;
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  string local_88 [32];
  undefined1 local_68 [24];
  string local_50 [32];
  undefined1 local_30 [8];
  shared_ptr<Token> identifier;
  bool error;
  Parser *this_local;
  
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"Expected a identifier",(allocator<char> *)(local_68 + 0x17));
  type = (TokenType)this;
  expect((Parser *)local_30,type,(bool *)0x18,
         (string *)
         ((long)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 7));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)(local_68 + 0x17));
  skipWhiteSpace(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"Expected an equals following var declaration",
             (allocator<char> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  expect((Parser *)local_68,type,(bool *)0x12,
         (string *)
         ((long)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 7));
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_a8,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"Expected a semicolon following expression of var declaration",&local_d9);
  expect((Parser *)local_b8,type,(bool *)0x10,
         (string *)
         ((long)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 7));
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  local_139 = 1;
  if ((identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1)
      == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
    local_139 = 1;
    if (bVar1) {
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_a8);
      local_139 = bVar1 ^ 0xff;
    }
  }
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       local_139 & 1;
  if (identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ == 0)
  {
    std::optional<std::shared_ptr<ExpressionAstNode>_>::value
              ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_a8);
    std::
    make_shared<AssignStatementAstNode,std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
              ((shared_ptr<Token> *)&local_f0,(shared_ptr<ExpressionAstNode> *)local_30);
    std::optional<std::shared_ptr<AssignStatementAstNode>_>::
    optional<std::shared_ptr<AssignStatementAstNode>,_true>(__return_storage_ptr__,&local_f0);
    std::shared_ptr<AssignStatementAstNode>::~shared_ptr(&local_f0);
  }
  else {
    std::optional<std::shared_ptr<AssignStatementAstNode>_>::optional(__return_storage_ptr__);
  }
  local_e0 = 1;
  std::optional<std::shared_ptr<ExpressionAstNode>_>::~optional
            ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_a8);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<AssignStatementAstNode>>
Parser::parseAssignStatement() noexcept {
  bool error = false;

  auto identifier = this->expect(TokenType::Identifier, error, "Expected a identifier");

  this->skipWhiteSpace();

  this->expect(TokenType::Assign, error, "Expected an equals following var declaration");

  auto expression = this->parseExpression();

  this->expect(TokenType::SemiColon, error,
    "Expected a semicolon following expression of var declaration");

  error = error || !identifier || !expression;

  if (error) { return std::nullopt; }

  return std::make_shared<AssignStatementAstNode>(identifier, expression.value());
}